

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O3

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<bool,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  byte *pbVar1;
  long lVar2;
  pointer puVar3;
  long lVar4;
  byte *pbVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = *(uint *)&this->num_components_;
  bVar6 = out_num_components;
  if ((byte)uVar7 < out_num_components) {
    bVar6 = (byte)uVar7;
  }
  if (bVar6 != 0) {
    lVar2 = this->byte_stride_;
    puVar3 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = this->byte_offset_;
    pbVar5 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar8 = 0;
    do {
      pbVar1 = puVar3 + uVar8 + lVar4 + (ulong)att_id.value_ * lVar2;
      if (pbVar5 <= pbVar1) {
        return false;
      }
      out_value[uVar8] = (uint)*pbVar1;
      uVar8 = uVar8 + 1;
      uVar7 = *(uint *)&this->num_components_;
      bVar6 = (byte)uVar7;
      if (out_num_components <= (byte)uVar7) {
        bVar6 = out_num_components;
      }
    } while (uVar8 < bVar6);
  }
  if ((byte)uVar7 < out_num_components) {
    memset(out_value + (uVar7 & 0xff),0,(ulong)((uint)out_num_components + ~(uVar7 & 0xff)) * 4 + 4)
    ;
  }
  return true;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }